

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O2

void __thiscall
icu_63::IndianCalendar::handleComputeFields
          (IndianCalendar *this,int32_t julianDay,UErrorCode *param_2)

{
  UBool UVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar8 = uprv_floor_63((double)julianDay + -0.5);
  dVar8 = dVar8 + 0.5;
  dVar9 = uprv_floor_63((dVar8 + -1721425.5) / 146097.0);
  dVar10 = uprv_floor_63(dVar8 + -1721425.5);
  dVar11 = uprv_floor_63((double)((int)dVar10 % 0x23ab1) / 36524.0);
  dVar10 = uprv_floor_63((double)((int)dVar10 % 0x23ab1));
  dVar12 = uprv_floor_63((double)((int)dVar10 % 0x8eac) / 1461.0);
  dVar10 = uprv_floor_63((double)((int)dVar10 % 0x8eac));
  dVar10 = uprv_floor_63((double)((int)dVar10 % 0x5b5) / 365.0);
  iVar4 = (int)(dVar12 * 4.0 + dVar9 * 400.0 + dVar11 * 100.0 + dVar10) +
          (uint)(dVar10 != 4.0 && dVar11 != 4.0);
  dVar10 = gregorianToJD(iVar4,1,1);
  dVar11 = gregorianToJD(iVar4,3,1);
  dVar9 = 0.0;
  if (dVar11 <= dVar8) {
    UVar1 = isGregorianLeap(iVar4);
    dVar9 = *(double *)(&DAT_002e20a0 + (ulong)(UVar1 == '\0') * 8);
  }
  dVar9 = uprv_floor_63((((dVar8 - dVar10) + dVar9) * 12.0 + 373.0) / 367.0);
  gregorianToJD(iVar4,(int)dVar9,1);
  dVar9 = gregorianToJD(iVar4,1,1);
  iVar6 = (int)((double)julianDay - dVar9);
  if (iVar6 < 0x50) {
    iVar3 = iVar4 + -0x4f;
    UVar1 = isGregorianLeap(iVar4 + -1);
    iVar4 = 0x1f - (uint)(UVar1 == '\0');
    uVar7 = iVar6 + iVar4 + 0xff;
  }
  else {
    iVar3 = iVar4 + -0x4e;
    UVar1 = isGregorianLeap(iVar4);
    iVar4 = 0x1f - (uint)(UVar1 == '\0');
    uVar7 = iVar6 - 0x50;
  }
  iVar6 = 0;
  uVar2 = uVar7 - iVar4;
  uVar5 = uVar7;
  if (iVar4 <= (int)uVar7) {
    if ((int)uVar2 < 0x9b) {
      uVar5 = (uint)(ushort)((short)uVar2 >> 0xf) << 0x10 | uVar2 & 0xffff;
      dVar9 = uprv_floor_63((double)((int)uVar5 / 0x1f & 0xffff));
      iVar6 = (int)dVar9 + 1;
      uVar5 = (uint)(short)((int)uVar5 % 0x1f);
    }
    else {
      uVar5 = (uVar2 - 0x9b) % 0x1e;
      dVar9 = uprv_floor_63((double)((uVar2 - 0x9b) / 0x1e));
      iVar6 = (int)dVar9 + 6;
    }
  }
  (this->super_Calendar).fFields[0] = 0;
  (this->super_Calendar).fStamp[0] = 1;
  (this->super_Calendar).fIsSet[0] = '\x01';
  (this->super_Calendar).fFields[0x13] = iVar3;
  (this->super_Calendar).fStamp[0x13] = 1;
  (this->super_Calendar).fIsSet[0x13] = '\x01';
  (this->super_Calendar).fFields[1] = iVar3;
  (this->super_Calendar).fStamp[1] = 1;
  (this->super_Calendar).fStamp[2] = 1;
  (this->super_Calendar).fIsSet[1] = '\x01';
  (this->super_Calendar).fIsSet[2] = '\x01';
  (this->super_Calendar).fFields[2] = iVar6;
  (this->super_Calendar).fFields[5] = uVar5 + 1;
  (this->super_Calendar).fStamp[5] = 1;
  (this->super_Calendar).fStamp[6] = 1;
  (this->super_Calendar).fIsSet[5] = '\x01';
  (this->super_Calendar).fIsSet[6] = '\x01';
  (this->super_Calendar).fFields[6] = uVar7 + 1;
  return;
}

Assistant:

void IndianCalendar::handleComputeFields(int32_t julianDay, UErrorCode&  /* status */) {
    double jdAtStartOfGregYear;
    int32_t leapMonth, IndianYear, yday, IndianMonth, IndianDayOfMonth, mday;
    int32_t gregorianYear;      // Stores gregorian date corresponding to Julian day;
    int32_t gd[3];

    gregorianYear = jdToGregorian(julianDay, gd)[0];          // Gregorian date for Julian day
    IndianYear = gregorianYear - INDIAN_ERA_START;            // Year in Saka era
    jdAtStartOfGregYear = gregorianToJD(gregorianYear, 1, 1); // JD at start of Gregorian year
    yday = (int32_t)(julianDay - jdAtStartOfGregYear);        // Day number in Gregorian year (starting from 0)

    if (yday < INDIAN_YEAR_START) {
        // Day is at the end of the preceding Saka year
        IndianYear -= 1;
        leapMonth = isGregorianLeap(gregorianYear - 1) ? 31 : 30; // Days in leapMonth this year, previous Gregorian year
        yday += leapMonth + (31 * 5) + (30 * 3) + 10;
    } else {
        leapMonth = isGregorianLeap(gregorianYear) ? 31 : 30; // Days in leapMonth this year
        yday -= INDIAN_YEAR_START;
    }

    if (yday < leapMonth) {
        IndianMonth = 0;
        IndianDayOfMonth = yday + 1;
    } else {
        mday = yday - leapMonth;
        if (mday < (31 * 5)) {
            IndianMonth = (int32_t)uprv_floor(mday / 31) + 1;
            IndianDayOfMonth = (mday % 31) + 1;
        } else {
            mday -= 31 * 5;
            IndianMonth = (int32_t)uprv_floor(mday / 30) + 6;
            IndianDayOfMonth = (mday % 30) + 1;
        }
   }

   internalSet(UCAL_ERA, 0);
   internalSet(UCAL_EXTENDED_YEAR, IndianYear);
   internalSet(UCAL_YEAR, IndianYear);
   internalSet(UCAL_MONTH, IndianMonth);
   internalSet(UCAL_DAY_OF_MONTH, IndianDayOfMonth);
   internalSet(UCAL_DAY_OF_YEAR, yday + 1); // yday is 0-based
}